

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O3

bool __thiscall OpenMD::Sphere::isInterior(Sphere *this,Vector3d *pos)

{
  uint i;
  long lVar1;
  double tmp;
  double dVar2;
  Vector<double,_3U> result;
  double local_28 [4];
  
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  lVar1 = 0;
  do {
    local_28[lVar1] =
         (pos->super_Vector<double,_3U>).data_[lVar1] -
         (this->origin_).super_Vector<double,_3U>.data_[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  dVar2 = 0.0;
  lVar1 = 0;
  do {
    dVar2 = dVar2 + local_28[lVar1] * local_28[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  return dVar2 < this->radius_;
}

Assistant:

bool Sphere::isInterior(Vector3d pos) {
    Vector3d r = pos - origin_;

    bool result;
    if (r.length() < radius_)
      result = true;
    else
      result = false;

    return result;
  }